

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfdrivr.c
# Opt level: O3

FT_UInt pcf_cmap_char_next(FT_CMap pcfcmap,FT_UInt32 *acharcode)

{
  uint uVar1;
  ushort uVar2;
  ushort uVar3;
  FT_Face pFVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  bool bVar13;
  
  pFVar4 = pcfcmap[1].charmap.face;
  uVar2 = *(ushort *)((long)&pFVar4->num_faces + 4);
  uVar7 = (*acharcode + 1 >> 8) - (uint)uVar2;
  uVar3 = (ushort)pFVar4->num_faces;
  uVar9 = (*acharcode + 1 & 0xff) - (uint)uVar3;
  uVar11 = (uint)*(ushort *)((long)&pFVar4->num_faces + 6) - (uint)uVar2;
  uVar1 = uVar11 + 1;
  uVar6 = 0;
  if ((int)uVar7 < 1) {
    uVar7 = uVar6;
  }
  if ((int)uVar9 < 1) {
    uVar9 = uVar6;
  }
  if (uVar7 < uVar1) {
    uVar8 = ((uint)*(ushort *)((long)&pFVar4->num_faces + 2) - (uint)uVar3) + 1;
    iVar12 = uVar7 * uVar8;
    uVar6 = 0;
    uVar5 = uVar7;
    uVar10 = uVar9;
    do {
      if (uVar10 < uVar8) {
        uVar9 = uVar10;
        do {
          uVar6 = (uint)*(ushort *)(pFVar4->face_flags + (ulong)(iVar12 + uVar9) * 2);
          uVar7 = uVar5;
          if (uVar6 != 0xffff) goto LAB_00228cdc;
          uVar9 = uVar9 + 1;
        } while (uVar8 != uVar9);
        uVar6 = 0xffff;
      }
      iVar12 = iVar12 + uVar8;
      uVar10 = 0;
      uVar9 = 0;
      bVar13 = uVar5 != uVar11;
      uVar7 = uVar1;
      uVar5 = uVar5 + 1;
    } while (bVar13);
  }
LAB_00228cdc:
  *acharcode = uVar9 + uVar3 | (uVar7 + uVar2) * 0x100;
  return uVar6;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt )
  pcf_cmap_char_next( FT_CMap    pcfcmap,   /* PCF_CMap */
                      FT_UInt32  *acharcode )
  {
    PCF_Enc    enc = ( (PCF_CMap)pcfcmap )->enc;
    FT_UInt32  charcode = *acharcode + 1;

    FT_UInt32  i = ( charcode >> 8   ) - enc->firstRow;
    FT_UInt32  j = ( charcode & 0xFF ) - enc->firstCol;
    FT_UInt32  h = enc->lastRow - enc->firstRow + 1;
    FT_UInt32  w = enc->lastCol - enc->firstCol + 1;

    FT_UInt  result = 0;


    /* adjust wrapped around "negative" values */
    if ( (FT_Int32)i < 0 )
      i = 0;
    if ( (FT_Int32)j < 0 )
      j = 0;

    for ( ; i < h; i++, j = 0 )
      for ( ; j < w; j++ )
      {
        result = (FT_UInt)enc->offset[i * w + j];
        if ( result != 0xFFFFU )
          goto Exit;
      }

  Exit:
    *acharcode = ( ( i + enc->firstRow ) << 8 ) | ( j + enc->firstCol );

    return result;
  }